

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

virtual_column_map_t *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetVirtualColumns
          (virtual_column_map_t *__return_storage_ptr__,ClientContext *context,
          optional_ptr<duckdb::FunctionData,_true> bind_data_p)

{
  optional_ptr<duckdb::FunctionData,_true> oVar1;
  MultiFileBindData *bind_data;
  optional_ptr<duckdb::FunctionData,_true> local_20;
  
  local_20.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_20);
  oVar1 = local_20;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  bind_data = (MultiFileBindData *)(local_20.ptr + 0xb);
  MultiFileReader::GetVirtualColumns
            (context,(MultiFileReaderBindData *)bind_data,__return_storage_ptr__);
  ParquetMultiFileInfo::GetVirtualColumns(context,bind_data,__return_storage_ptr__);
  if ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
       *)(oVar1.ptr + 0x2c) !=
      (_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
       *)__return_storage_ptr__) {
    ::std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::TableColumn>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(oVar1.ptr + 0x2c),&__return_storage_ptr__->_M_h);
  }
  return __return_storage_ptr__;
}

Assistant:

static virtual_column_map_t MultiFileGetVirtualColumns(ClientContext &context,
	                                                       optional_ptr<FunctionData> bind_data_p) {
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();
		virtual_column_map_t result;
		MultiFileReader::GetVirtualColumns(context, bind_data.reader_bind, result);

		OP::GetVirtualColumns(context, bind_data, result);

		bind_data.virtual_columns = result;
		return result;
	}